

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ushort uVar8;
  ushort uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  byte bVar29;
  ulong *puVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  byte bVar47;
  ulong uVar48;
  float fVar49;
  float fVar92;
  float fVar93;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar94;
  undefined1 auVar89 [32];
  undefined1 auVar64 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1371;
  ulong local_1370;
  size_t local_1368;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  long local_12e0;
  long local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  ulong local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  ulong *local_12a8;
  long local_12a0;
  ulong local_1298;
  RTCFilterFunctionNArguments local_1290;
  undefined1 local_1260 [8];
  float fStack_1258;
  float fStack_1254;
  undefined1 local_1250 [8];
  float fStack_1248;
  float fStack_1244;
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float local_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined1 local_1220 [32];
  undefined1 local_1200 [16];
  float local_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 *local_1120;
  byte local_1118;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  float local_10a0 [4];
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  uint uStack_1084;
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  uint uStack_1064;
  undefined1 local_1060 [32];
  float local_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  float fVar2;
  float fVar3;
  undefined1 auVar52 [16];
  
  puVar30 = local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar5 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1340._4_4_ = uVar5;
  local_1340._0_4_ = uVar5;
  local_1340._8_4_ = uVar5;
  local_1340._12_4_ = uVar5;
  auVar139 = ZEXT1664(local_1340);
  uVar5 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_11c0._4_4_ = uVar5;
  local_11c0._0_4_ = uVar5;
  local_11c0._8_4_ = uVar5;
  local_11c0._12_4_ = uVar5;
  auVar140 = ZEXT1664(local_11c0);
  uVar5 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_11d0._4_4_ = uVar5;
  local_11d0._0_4_ = uVar5;
  local_11d0._8_4_ = uVar5;
  local_11d0._12_4_ = uVar5;
  auVar143 = ZEXT1664(local_11d0);
  fVar120 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar115 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar49 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar92 = fVar120 * 0.99999964;
  fVar93 = fVar115 * 0.99999964;
  local_1240._4_4_ = fVar93;
  local_1240._0_4_ = fVar93;
  fStack_1238 = fVar93;
  fStack_1234 = fVar93;
  auVar136 = ZEXT1664(_local_1240);
  fVar93 = fVar49 * 0.99999964;
  local_1250._4_4_ = fVar93;
  local_1250._0_4_ = fVar93;
  fStack_1248 = fVar93;
  fStack_1244 = fVar93;
  auVar131 = ZEXT1664(_local_1250);
  fVar120 = fVar120 * 1.0000004;
  local_1260._4_4_ = fVar120;
  local_1260._0_4_ = fVar120;
  fStack_1258 = fVar120;
  fStack_1254 = fVar120;
  auVar133 = ZEXT1664(_local_1260);
  fVar115 = fVar115 * 1.0000004;
  fVar49 = fVar49 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar45 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar46 = uVar41 ^ 0x10;
  uVar43 = uVar42 ^ 0x10;
  uVar39 = uVar45 ^ 0x10;
  local_1200 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar148 = ZEXT1664(local_1200);
  auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar149 = ZEXT1664(auVar50);
  local_12e8 = uVar41 >> 2;
  local_12f0 = uVar46 >> 2;
  local_12f8 = uVar42 >> 2;
  local_1300 = uVar43 >> 2;
  local_1308 = uVar45 >> 2;
  local_1310 = uVar39 >> 2;
  local_11a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar120 = fVar92;
  fVar93 = fVar92;
  fVar94 = fVar92;
  fVar95 = fVar115;
  fVar96 = fVar115;
  fVar97 = fVar115;
  fVar145 = fVar49;
  fVar146 = fVar49;
  fVar147 = fVar49;
  local_1370 = uVar39;
  local_1368 = k;
  local_12d0 = uVar43;
  local_12c8 = uVar46;
  local_12c0 = uVar45;
  local_12b8 = uVar42;
  local_12b0 = uVar41;
  local_1230 = fVar92;
  fStack_122c = fVar92;
  fStack_1228 = fVar92;
  fStack_1224 = fVar92;
  local_11f0 = fVar49;
  fStack_11ec = fVar49;
  fStack_11e8 = fVar49;
  fStack_11e4 = fVar49;
  local_11e0 = fVar115;
  fStack_11dc = fVar115;
  fStack_11d8 = fVar115;
  fStack_11d4 = fVar115;
  do {
    local_11b0 = auVar149._0_16_;
    while (pfVar4 = (float *)(puVar30 + -1), puVar30 = puVar30 + -2,
          *pfVar4 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar44 = *puVar30;
joined_r0x006fd957:
      if ((uVar44 & 8) != 0) {
        local_12e0 = (ulong)((uint)uVar44 & 0xf) - 8;
        if (local_12e0 != 0) {
          uVar44 = uVar44 & 0xfffffffffffffff0;
          local_12d8 = 0;
          local_12a8 = puVar30;
          do {
            lVar31 = local_12d8 * 0x58;
            local_12a0 = lVar31 + uVar44;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = *(ulong *)(uVar44 + 0x20 + lVar31);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = *(ulong *)(uVar44 + 0x24 + lVar31);
            uVar48 = vpcmpub_avx512vl(auVar50,auVar52,2);
            uVar5 = *(undefined4 *)(uVar44 + 0x38 + lVar31);
            auVar51._4_4_ = uVar5;
            auVar51._0_4_ = uVar5;
            auVar51._8_4_ = uVar5;
            auVar51._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(uVar44 + 0x44 + lVar31);
            auVar110._4_4_ = uVar5;
            auVar110._0_4_ = uVar5;
            auVar110._8_4_ = uVar5;
            auVar110._12_4_ = uVar5;
            auVar118._8_8_ = 0;
            auVar118._0_8_ = *(ulong *)(local_12e8 + 0x20 + local_12a0);
            auVar50 = vpmovzxbd_avx(auVar118);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar64 = vfmadd213ps_fma(auVar50,auVar110,auVar51);
            auVar123._8_8_ = 0;
            auVar123._0_8_ = *(ulong *)(local_12f0 + 0x20 + local_12a0);
            auVar50 = vpmovzxbd_avx(auVar123);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar51 = vfmadd213ps_fma(auVar50,auVar110,auVar51);
            uVar5 = *(undefined4 *)(uVar44 + 0x3c + lVar31);
            auVar100._4_4_ = uVar5;
            auVar100._0_4_ = uVar5;
            auVar100._8_4_ = uVar5;
            auVar100._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(uVar44 + 0x48 + lVar31);
            auVar111._4_4_ = uVar5;
            auVar111._0_4_ = uVar5;
            auVar111._8_4_ = uVar5;
            auVar111._12_4_ = uVar5;
            auVar128._8_8_ = 0;
            auVar128._0_8_ = *(ulong *)(local_12f8 + 0x20 + local_12a0);
            auVar50 = vpmovzxbd_avx(auVar128);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar52 = vfmadd213ps_fma(auVar50,auVar111,auVar100);
            auVar132._8_8_ = 0;
            auVar132._0_8_ = *(ulong *)(local_1300 + 0x20 + local_12a0);
            auVar50 = vpmovzxbd_avx(auVar132);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar100 = vfmadd213ps_fma(auVar50,auVar111,auVar100);
            uVar5 = *(undefined4 *)(uVar44 + 0x40 + lVar31);
            auVar101._4_4_ = uVar5;
            auVar101._0_4_ = uVar5;
            auVar101._8_4_ = uVar5;
            auVar101._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(uVar44 + 0x4c + lVar31);
            auVar112._4_4_ = uVar5;
            auVar112._0_4_ = uVar5;
            auVar112._8_4_ = uVar5;
            auVar112._12_4_ = uVar5;
            auVar135._8_8_ = 0;
            auVar135._0_8_ = *(ulong *)(local_1308 + 0x20 + local_12a0);
            auVar50 = vpmovzxbd_avx(auVar135);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar110 = vfmadd213ps_fma(auVar50,auVar112,auVar101);
            auVar137._8_8_ = 0;
            auVar137._0_8_ = *(ulong *)(local_1310 + 0x20 + local_12a0);
            auVar50 = vpmovzxbd_avx(auVar137);
            auVar50 = vcvtdq2ps_avx(auVar50);
            auVar101 = vfmadd213ps_fma(auVar50,auVar112,auVar101);
            auVar50 = vsubps_avx(auVar64,local_1340);
            auVar64._0_4_ = auVar50._0_4_ * local_1230;
            auVar64._4_4_ = auVar50._4_4_ * fStack_122c;
            auVar64._8_4_ = auVar50._8_4_ * fStack_1228;
            auVar64._12_4_ = auVar50._12_4_ * fStack_1224;
            auVar50 = vsubps_avx(auVar52,auVar140._0_16_);
            auVar113._0_4_ = auVar50._0_4_ * (float)local_1240._0_4_;
            auVar113._4_4_ = auVar50._4_4_ * (float)local_1240._4_4_;
            auVar113._8_4_ = auVar50._8_4_ * fStack_1238;
            auVar113._12_4_ = auVar50._12_4_ * fStack_1234;
            auVar50 = vmaxps_avx(auVar64,auVar113);
            auVar64 = vsubps_avx(auVar110,auVar143._0_16_);
            auVar114._0_4_ = auVar64._0_4_ * (float)local_1250._0_4_;
            auVar114._4_4_ = auVar64._4_4_ * (float)local_1250._4_4_;
            auVar114._8_4_ = auVar64._8_4_ * fStack_1248;
            auVar114._12_4_ = auVar64._12_4_ * fStack_1244;
            auVar64 = vsubps_avx(auVar51,local_1340);
            auVar119._0_4_ = auVar64._0_4_ * (float)local_1260._0_4_;
            auVar119._4_4_ = auVar64._4_4_ * (float)local_1260._4_4_;
            auVar119._8_4_ = auVar64._8_4_ * fStack_1258;
            auVar119._12_4_ = auVar64._12_4_ * fStack_1254;
            auVar64 = vsubps_avx(auVar100,auVar140._0_16_);
            auVar124._0_4_ = fVar115 * auVar64._0_4_;
            auVar124._4_4_ = fVar95 * auVar64._4_4_;
            auVar124._8_4_ = fVar96 * auVar64._8_4_;
            auVar124._12_4_ = fVar97 * auVar64._12_4_;
            auVar64 = vminps_avx(auVar119,auVar124);
            auVar51 = vsubps_avx(auVar101,auVar143._0_16_);
            auVar125._0_4_ = fVar49 * auVar51._0_4_;
            auVar125._4_4_ = fVar145 * auVar51._4_4_;
            auVar125._8_4_ = fVar146 * auVar51._8_4_;
            auVar125._12_4_ = fVar147 * auVar51._12_4_;
            auVar51 = vmaxps_avx512vl(auVar114,auVar148._0_16_);
            local_1190 = vmaxps_avx(auVar50,auVar51);
            auVar50 = vminps_avx512vl(auVar125,auVar149._0_16_);
            auVar50 = vminps_avx(auVar64,auVar50);
            local_1298 = vcmpps_avx512vl(local_1190,auVar50,2);
            local_1298 = uVar48 & 0xff & local_1298;
            if ((char)local_1298 != '\0') {
              do {
                lVar31 = 0;
                for (uVar48 = local_1298; (uVar48 & 1) == 0;
                    uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                  lVar31 = lVar31 + 1;
                }
                fVar120 = *(float *)(ray + k * 4 + 0x80);
                if (*(float *)(local_1190 + lVar31 * 4) <= fVar120) {
                  uVar8 = *(ushort *)(local_12a0 + lVar31 * 8);
                  uVar9 = *(ushort *)(local_12a0 + 2 + lVar31 * 8);
                  uVar36 = *(uint *)(local_12a0 + 0x50);
                  uVar34 = *(uint *)(local_12a0 + 4 + lVar31 * 8);
                  pGVar10 = (context->scene->geometries).items[uVar36].ptr;
                  lVar31 = *(long *)&pGVar10->field_0x58;
                  lVar40 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar34;
                  uVar33 = *(uint *)(lVar31 + 4 + lVar40);
                  uVar41 = (ulong)uVar33;
                  uVar42 = (ulong)(uVar33 * (uVar9 & 0x7fff) +
                                  *(int *)(lVar31 + lVar40) + (uVar8 & 0x7fff));
                  lVar11 = *(long *)&pGVar10[1].time_range.upper;
                  p_Var12 = pGVar10[1].intersectionFilterN;
                  auVar50 = *(undefined1 (*) [16])(lVar11 + (uVar42 + 1) * (long)p_Var12);
                  auVar64 = *(undefined1 (*) [16])(lVar11 + (uVar42 + uVar41) * (long)p_Var12);
                  lVar32 = uVar42 + uVar41 + 1;
                  auVar51 = *(undefined1 (*) [16])(lVar11 + lVar32 * (long)p_Var12);
                  uVar39 = (ulong)(-1 < (short)uVar8);
                  auVar52 = *(undefined1 (*) [16])(lVar11 + (uVar42 + uVar39 + 1) * (long)p_Var12);
                  lVar37 = uVar39 + lVar32;
                  auVar100 = *(undefined1 (*) [16])(lVar11 + lVar37 * (long)p_Var12);
                  uVar39 = 0;
                  if (-1 < (short)uVar9) {
                    uVar39 = uVar41;
                  }
                  auVar110 = *(undefined1 (*) [16])
                              (lVar11 + (uVar42 + uVar41 + uVar39) * (long)p_Var12);
                  auVar101 = *(undefined1 (*) [16])(lVar11 + (lVar32 + uVar39) * (long)p_Var12);
                  auVar77._16_16_ =
                       *(undefined1 (*) [16])(lVar11 + (uVar39 + lVar37) * (long)p_Var12);
                  auVar77._0_16_ = auVar51;
                  auVar112 = vunpcklps_avx(auVar50,auVar100);
                  auVar111 = vunpckhps_avx(auVar50,auVar100);
                  auVar113 = vunpcklps_avx(auVar52,auVar51);
                  auVar52 = vunpckhps_avx(auVar52,auVar51);
                  auVar114 = vunpcklps_avx(auVar111,auVar52);
                  auVar118 = vunpcklps_avx(auVar112,auVar113);
                  auVar52 = vunpckhps_avx(auVar112,auVar113);
                  auVar112 = vunpcklps_avx(auVar64,auVar101);
                  auVar111 = vunpckhps_avx(auVar64,auVar101);
                  auVar113 = vunpcklps_avx(auVar51,auVar110);
                  auVar110 = vunpckhps_avx(auVar51,auVar110);
                  auVar111 = vunpcklps_avx(auVar111,auVar110);
                  auVar119 = vunpcklps_avx(auVar112,auVar113);
                  auVar110 = vunpckhps_avx(auVar112,auVar113);
                  auVar74._16_16_ = auVar101;
                  auVar74._0_16_ = auVar64;
                  auVar68._16_16_ = auVar100;
                  auVar68._0_16_ = auVar50;
                  auVar89 = vunpcklps_avx(auVar68,auVar74);
                  auVar67._16_16_ = auVar51;
                  auVar67._0_16_ = *(undefined1 (*) [16])(lVar11 + (long)p_Var12 * uVar42);
                  auVar86 = vunpcklps_avx(auVar67,auVar77);
                  auVar70 = vunpcklps_avx(auVar86,auVar89);
                  auVar86 = vunpckhps_avx(auVar86,auVar89);
                  auVar89 = vunpckhps_avx(auVar68,auVar74);
                  auVar69 = vunpckhps_avx(auVar67,auVar77);
                  auVar69 = vunpcklps_avx(auVar69,auVar89);
                  auVar73._16_16_ = auVar118;
                  auVar73._0_16_ = auVar118;
                  auVar75._16_16_ = auVar52;
                  auVar75._0_16_ = auVar52;
                  auVar76._16_16_ = auVar114;
                  auVar76._0_16_ = auVar114;
                  auVar78._16_16_ = auVar119;
                  auVar78._0_16_ = auVar119;
                  auVar80._16_16_ = auVar110;
                  auVar80._0_16_ = auVar110;
                  uVar5 = *(undefined4 *)(ray + local_1368 * 4);
                  auVar81._4_4_ = uVar5;
                  auVar81._0_4_ = uVar5;
                  auVar81._8_4_ = uVar5;
                  auVar81._12_4_ = uVar5;
                  auVar81._16_4_ = uVar5;
                  auVar81._20_4_ = uVar5;
                  auVar81._24_4_ = uVar5;
                  auVar81._28_4_ = uVar5;
                  auVar65 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + local_1368 * 4 + 0x10)));
                  auVar66 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + local_1368 * 4 + 0x20)));
                  uVar5 = *(undefined4 *)(ray + local_1368 * 4 + 0x40);
                  auVar138._4_4_ = uVar5;
                  auVar138._0_4_ = uVar5;
                  auVar138._8_4_ = uVar5;
                  auVar138._12_4_ = uVar5;
                  auVar138._16_4_ = uVar5;
                  auVar138._20_4_ = uVar5;
                  auVar138._24_4_ = uVar5;
                  auVar138._28_4_ = uVar5;
                  auVar79._16_16_ = auVar111;
                  auVar79._0_16_ = auVar111;
                  uVar5 = *(undefined4 *)(ray + local_1368 * 4 + 0x50);
                  auVar141._4_4_ = uVar5;
                  auVar141._0_4_ = uVar5;
                  auVar141._8_4_ = uVar5;
                  auVar141._12_4_ = uVar5;
                  auVar141._16_4_ = uVar5;
                  auVar141._20_4_ = uVar5;
                  auVar141._24_4_ = uVar5;
                  auVar141._28_4_ = uVar5;
                  fVar115 = *(float *)(ray + local_1368 * 4 + 0x60);
                  auVar144._4_4_ = fVar115;
                  auVar144._0_4_ = fVar115;
                  auVar144._8_4_ = fVar115;
                  auVar144._12_4_ = fVar115;
                  auVar144._16_4_ = fVar115;
                  auVar144._20_4_ = fVar115;
                  auVar144._24_4_ = fVar115;
                  auVar144._28_4_ = fVar115;
                  auVar89 = vsubps_avx(auVar70,auVar81);
                  auVar67 = vsubps_avx512vl(auVar86,auVar65);
                  auVar68 = vsubps_avx512vl(auVar69,auVar66);
                  auVar86 = vsubps_avx(auVar73,auVar81);
                  auVar69 = vsubps_avx512vl(auVar75,auVar65);
                  auVar70 = vsubps_avx512vl(auVar76,auVar66);
                  auVar71 = vsubps_avx512vl(auVar78,auVar81);
                  auVar72 = vsubps_avx512vl(auVar80,auVar65);
                  auVar66 = vsubps_avx512vl(auVar79,auVar66);
                  auVar73 = vsubps_avx512vl(auVar71,auVar89);
                  auVar74 = vsubps_avx512vl(auVar72,auVar67);
                  auVar75 = vsubps_avx512vl(auVar66,auVar68);
                  auVar76 = vsubps_avx512vl(auVar89,auVar86);
                  auVar77 = vsubps_avx512vl(auVar67,auVar69);
                  auVar78 = vsubps_avx512vl(auVar68,auVar70);
                  auVar79 = vsubps_avx512vl(auVar86,auVar71);
                  auVar80 = vsubps_avx512vl(auVar69,auVar72);
                  auVar81 = vsubps_avx512vl(auVar70,auVar66);
                  auVar65 = vaddps_avx512vl(auVar71,auVar89);
                  auVar82 = vaddps_avx512vl(auVar72,auVar67);
                  auVar83 = vaddps_avx512vl(auVar66,auVar68);
                  auVar84 = vmulps_avx512vl(auVar82,auVar75);
                  auVar84 = vfmsub231ps_avx512vl(auVar84,auVar74,auVar83);
                  auVar83 = vmulps_avx512vl(auVar83,auVar73);
                  auVar83 = vfmsub231ps_avx512vl(auVar83,auVar75,auVar65);
                  auVar65 = vmulps_avx512vl(auVar65,auVar74);
                  auVar50 = vfmsub231ps_fma(auVar65,auVar73,auVar82);
                  auVar82._0_4_ = auVar50._0_4_ * fVar115;
                  auVar82._4_4_ = auVar50._4_4_ * fVar115;
                  auVar82._8_4_ = auVar50._8_4_ * fVar115;
                  auVar82._12_4_ = auVar50._12_4_ * fVar115;
                  auVar82._16_4_ = fVar115 * 0.0;
                  auVar82._20_4_ = fVar115 * 0.0;
                  auVar82._24_4_ = fVar115 * 0.0;
                  auVar82._28_4_ = 0;
                  auVar65 = vfmadd231ps_avx512vl(auVar82,auVar141,auVar83);
                  auVar82 = vfmadd231ps_avx512vl(auVar65,auVar138,auVar84);
                  auVar85._0_4_ = auVar89._0_4_ + auVar86._0_4_;
                  auVar85._4_4_ = auVar89._4_4_ + auVar86._4_4_;
                  auVar85._8_4_ = auVar89._8_4_ + auVar86._8_4_;
                  auVar85._12_4_ = auVar89._12_4_ + auVar86._12_4_;
                  auVar85._16_4_ = auVar89._16_4_ + auVar86._16_4_;
                  auVar85._20_4_ = auVar89._20_4_ + auVar86._20_4_;
                  auVar85._24_4_ = auVar89._24_4_ + auVar86._24_4_;
                  auVar85._28_4_ = auVar89._28_4_ + auVar86._28_4_;
                  auVar65 = vaddps_avx512vl(auVar67,auVar69);
                  auVar83 = vaddps_avx512vl(auVar68,auVar70);
                  auVar84 = vmulps_avx512vl(auVar65,auVar78);
                  auVar84 = vfmsub231ps_avx512vl(auVar84,auVar77,auVar83);
                  auVar83 = vmulps_avx512vl(auVar83,auVar76);
                  auVar83 = vfmsub231ps_avx512vl(auVar83,auVar78,auVar85);
                  auVar85 = vmulps_avx512vl(auVar85,auVar77);
                  auVar85 = vfmsub231ps_avx512vl(auVar85,auVar76,auVar65);
                  auVar65._4_4_ = auVar85._4_4_ * fVar115;
                  auVar65._0_4_ = auVar85._0_4_ * fVar115;
                  auVar65._8_4_ = auVar85._8_4_ * fVar115;
                  auVar65._12_4_ = auVar85._12_4_ * fVar115;
                  auVar65._16_4_ = auVar85._16_4_ * fVar115;
                  auVar65._20_4_ = auVar85._20_4_ * fVar115;
                  auVar65._24_4_ = auVar85._24_4_ * fVar115;
                  auVar65._28_4_ = auVar85._28_4_;
                  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar141,auVar83);
                  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar138,auVar84);
                  auVar86 = vaddps_avx512vl(auVar86,auVar71);
                  auVar69 = vaddps_avx512vl(auVar69,auVar72);
                  auVar70 = vaddps_avx512vl(auVar70,auVar66);
                  auVar66 = vmulps_avx512vl(auVar69,auVar81);
                  auVar72 = vfmsub231ps_avx512vl(auVar66,auVar80,auVar70);
                  auVar66._4_4_ = auVar70._4_4_ * auVar79._4_4_;
                  auVar66._0_4_ = auVar70._0_4_ * auVar79._0_4_;
                  auVar66._8_4_ = auVar70._8_4_ * auVar79._8_4_;
                  auVar66._12_4_ = auVar70._12_4_ * auVar79._12_4_;
                  auVar66._16_4_ = auVar70._16_4_ * auVar79._16_4_;
                  auVar66._20_4_ = auVar70._20_4_ * auVar79._20_4_;
                  auVar66._24_4_ = auVar70._24_4_ * auVar79._24_4_;
                  auVar66._28_4_ = auVar70._28_4_;
                  auVar50 = vfmsub231ps_fma(auVar66,auVar81,auVar86);
                  auVar71._4_4_ = auVar86._4_4_ * auVar80._4_4_;
                  auVar71._0_4_ = auVar86._0_4_ * auVar80._0_4_;
                  auVar71._8_4_ = auVar86._8_4_ * auVar80._8_4_;
                  auVar71._12_4_ = auVar86._12_4_ * auVar80._12_4_;
                  auVar71._16_4_ = auVar86._16_4_ * auVar80._16_4_;
                  auVar71._20_4_ = auVar86._20_4_ * auVar80._20_4_;
                  auVar71._24_4_ = auVar86._24_4_ * auVar80._24_4_;
                  auVar71._28_4_ = auVar86._28_4_;
                  auVar86 = vfmsub231ps_avx512vl(auVar71,auVar79,auVar69);
                  auVar86 = vmulps_avx512vl(auVar86,auVar144);
                  auVar86 = vfmadd231ps_avx512vl(auVar86,auVar141,ZEXT1632(auVar50));
                  auVar66 = vfmadd231ps_avx512vl(auVar86,auVar138,auVar72);
                  auVar72._0_4_ = auVar82._0_4_ + auVar65._0_4_;
                  auVar72._4_4_ = auVar82._4_4_ + auVar65._4_4_;
                  auVar72._8_4_ = auVar82._8_4_ + auVar65._8_4_;
                  auVar72._12_4_ = auVar82._12_4_ + auVar65._12_4_;
                  auVar72._16_4_ = auVar82._16_4_ + auVar65._16_4_;
                  auVar72._20_4_ = auVar82._20_4_ + auVar65._20_4_;
                  auVar72._24_4_ = auVar82._24_4_ + auVar65._24_4_;
                  auVar72._28_4_ = auVar82._28_4_ + auVar65._28_4_;
                  local_1140 = vaddps_avx512vl(auVar66,auVar72);
                  auVar86._8_4_ = 0x7fffffff;
                  auVar86._0_8_ = 0x7fffffff7fffffff;
                  auVar86._12_4_ = 0x7fffffff;
                  auVar86._16_4_ = 0x7fffffff;
                  auVar86._20_4_ = 0x7fffffff;
                  auVar86._24_4_ = 0x7fffffff;
                  auVar86._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_1140,auVar86);
                  auVar69._8_4_ = 0x34000000;
                  auVar69._0_8_ = 0x3400000034000000;
                  auVar69._12_4_ = 0x34000000;
                  auVar69._16_4_ = 0x34000000;
                  auVar69._20_4_ = 0x34000000;
                  auVar69._24_4_ = 0x34000000;
                  auVar69._28_4_ = 0x34000000;
                  auVar86 = vmulps_avx512vl(local_1140,auVar69);
                  auVar69 = vminps_avx512vl(auVar82,auVar65);
                  auVar69 = vminps_avx512vl(auVar69,auVar66);
                  auVar70._8_4_ = 0x80000000;
                  auVar70._0_8_ = 0x8000000080000000;
                  auVar70._12_4_ = 0x80000000;
                  auVar70._16_4_ = 0x80000000;
                  auVar70._20_4_ = 0x80000000;
                  auVar70._24_4_ = 0x80000000;
                  auVar70._28_4_ = 0x80000000;
                  auVar70 = vxorps_avx512vl(auVar86,auVar70);
                  uVar22 = vcmpps_avx512vl(auVar69,auVar70,5);
                  auVar69 = vmaxps_avx512vl(auVar82,auVar65);
                  auVar69 = vmaxps_avx512vl(auVar69,auVar66);
                  uVar23 = vcmpps_avx512vl(auVar69,auVar86,2);
                  bVar47 = (byte)uVar22 | (byte)uVar23;
                  k = local_1368;
                  if (bVar47 != 0) {
                    auVar86 = vmulps_avx512vl(auVar77,auVar75);
                    auVar69 = vmulps_avx512vl(auVar73,auVar78);
                    auVar70 = vmulps_avx512vl(auVar76,auVar74);
                    auVar66 = vmulps_avx512vl(auVar80,auVar78);
                    auVar71 = vmulps_avx512vl(auVar76,auVar81);
                    auVar72 = vmulps_avx512vl(auVar79,auVar77);
                    auVar74 = vfmsub213ps_avx512vl(auVar74,auVar78,auVar86);
                    auVar75 = vfmsub213ps_avx512vl(auVar75,auVar76,auVar69);
                    auVar73 = vfmsub213ps_avx512vl(auVar73,auVar77,auVar70);
                    auVar77 = vfmsub213ps_avx512vl(auVar81,auVar77,auVar66);
                    auVar78 = vfmsub213ps_avx512vl(auVar79,auVar78,auVar71);
                    auVar76 = vfmsub213ps_avx512vl(auVar80,auVar76,auVar72);
                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    vandps_avx512vl(auVar86,auVar79);
                    vandps_avx512vl(auVar66,auVar79);
                    uVar39 = vcmpps_avx512vl(auVar79,auVar79,1);
                    vandps_avx512vl(auVar69,auVar79);
                    vandps_avx512vl(auVar71,auVar79);
                    uVar41 = vcmpps_avx512vl(auVar79,auVar79,1);
                    vandps_avx512vl(auVar70,auVar79);
                    vandps_avx512vl(auVar72,auVar79);
                    uVar42 = vcmpps_avx512vl(auVar79,auVar79,1);
                    bVar20 = (bool)((byte)uVar39 & 1);
                    auVar87._0_4_ =
                         (float)((uint)bVar20 * auVar74._0_4_ | (uint)!bVar20 * auVar77._0_4_);
                    bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                    auVar87._4_4_ =
                         (float)((uint)bVar20 * auVar74._4_4_ | (uint)!bVar20 * auVar77._4_4_);
                    bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                    auVar87._8_4_ =
                         (float)((uint)bVar20 * auVar74._8_4_ | (uint)!bVar20 * auVar77._8_4_);
                    bVar20 = (bool)((byte)(uVar39 >> 3) & 1);
                    auVar87._12_4_ =
                         (float)((uint)bVar20 * auVar74._12_4_ | (uint)!bVar20 * auVar77._12_4_);
                    bVar20 = (bool)((byte)(uVar39 >> 4) & 1);
                    auVar87._16_4_ =
                         (float)((uint)bVar20 * auVar74._16_4_ | (uint)!bVar20 * auVar77._16_4_);
                    bVar20 = (bool)((byte)(uVar39 >> 5) & 1);
                    auVar87._20_4_ =
                         (float)((uint)bVar20 * auVar74._20_4_ | (uint)!bVar20 * auVar77._20_4_);
                    bVar20 = (bool)((byte)(uVar39 >> 6) & 1);
                    auVar87._24_4_ =
                         (float)((uint)bVar20 * auVar74._24_4_ | (uint)!bVar20 * auVar77._24_4_);
                    bVar20 = SUB81(uVar39 >> 7,0);
                    auVar87._28_4_ = (uint)bVar20 * auVar74._28_4_ | (uint)!bVar20 * auVar77._28_4_;
                    bVar20 = (bool)((byte)uVar41 & 1);
                    auVar88._0_4_ =
                         (float)((uint)bVar20 * auVar75._0_4_ | (uint)!bVar20 * auVar78._0_4_);
                    bVar20 = (bool)((byte)(uVar41 >> 1) & 1);
                    auVar88._4_4_ =
                         (float)((uint)bVar20 * auVar75._4_4_ | (uint)!bVar20 * auVar78._4_4_);
                    bVar20 = (bool)((byte)(uVar41 >> 2) & 1);
                    auVar88._8_4_ =
                         (float)((uint)bVar20 * auVar75._8_4_ | (uint)!bVar20 * auVar78._8_4_);
                    bVar20 = (bool)((byte)(uVar41 >> 3) & 1);
                    auVar88._12_4_ =
                         (float)((uint)bVar20 * auVar75._12_4_ | (uint)!bVar20 * auVar78._12_4_);
                    bVar20 = (bool)((byte)(uVar41 >> 4) & 1);
                    auVar88._16_4_ =
                         (float)((uint)bVar20 * auVar75._16_4_ | (uint)!bVar20 * auVar78._16_4_);
                    bVar20 = (bool)((byte)(uVar41 >> 5) & 1);
                    auVar88._20_4_ =
                         (float)((uint)bVar20 * auVar75._20_4_ | (uint)!bVar20 * auVar78._20_4_);
                    bVar20 = (bool)((byte)(uVar41 >> 6) & 1);
                    auVar88._24_4_ =
                         (float)((uint)bVar20 * auVar75._24_4_ | (uint)!bVar20 * auVar78._24_4_);
                    bVar20 = SUB81(uVar41 >> 7,0);
                    auVar88._28_4_ = (uint)bVar20 * auVar75._28_4_ | (uint)!bVar20 * auVar78._28_4_;
                    bVar20 = (bool)((byte)uVar42 & 1);
                    fVar49 = (float)((uint)bVar20 * auVar73._0_4_ | (uint)!bVar20 * auVar76._0_4_);
                    bVar20 = (bool)((byte)(uVar42 >> 1) & 1);
                    fVar92 = (float)((uint)bVar20 * auVar73._4_4_ | (uint)!bVar20 * auVar76._4_4_);
                    bVar20 = (bool)((byte)(uVar42 >> 2) & 1);
                    fVar93 = (float)((uint)bVar20 * auVar73._8_4_ | (uint)!bVar20 * auVar76._8_4_);
                    bVar20 = (bool)((byte)(uVar42 >> 3) & 1);
                    fVar94 = (float)((uint)bVar20 * auVar73._12_4_ | (uint)!bVar20 * auVar76._12_4_)
                    ;
                    bVar20 = (bool)((byte)(uVar42 >> 4) & 1);
                    fVar95 = (float)((uint)bVar20 * auVar73._16_4_ | (uint)!bVar20 * auVar76._16_4_)
                    ;
                    bVar20 = (bool)((byte)(uVar42 >> 5) & 1);
                    fVar96 = (float)((uint)bVar20 * auVar73._20_4_ | (uint)!bVar20 * auVar76._20_4_)
                    ;
                    bVar20 = (bool)((byte)(uVar42 >> 6) & 1);
                    fVar97 = (float)((uint)bVar20 * auVar73._24_4_ | (uint)!bVar20 * auVar76._24_4_)
                    ;
                    bVar20 = SUB81(uVar42 >> 7,0);
                    auVar84._4_4_ = fVar115 * fVar92;
                    auVar84._0_4_ = fVar115 * fVar49;
                    auVar84._8_4_ = fVar115 * fVar93;
                    auVar84._12_4_ = fVar115 * fVar94;
                    auVar84._16_4_ = fVar115 * fVar95;
                    auVar84._20_4_ = fVar115 * fVar96;
                    auVar84._24_4_ = fVar115 * fVar97;
                    auVar84._28_4_ = fVar115;
                    auVar50 = vfmadd213ps_fma(auVar141,auVar88,auVar84);
                    auVar50 = vfmadd213ps_fma(auVar138,auVar87,ZEXT1632(auVar50));
                    auVar69 = ZEXT1632(CONCAT412(auVar50._12_4_ + auVar50._12_4_,
                                                 CONCAT48(auVar50._8_4_ + auVar50._8_4_,
                                                          CONCAT44(auVar50._4_4_ + auVar50._4_4_,
                                                                   auVar50._0_4_ + auVar50._0_4_))))
                    ;
                    auVar142._0_4_ = auVar68._0_4_ * fVar49;
                    auVar142._4_4_ = auVar68._4_4_ * fVar92;
                    auVar142._8_4_ = auVar68._8_4_ * fVar93;
                    auVar142._12_4_ = auVar68._12_4_ * fVar94;
                    auVar142._16_4_ = auVar68._16_4_ * fVar95;
                    auVar142._20_4_ = auVar68._20_4_ * fVar96;
                    auVar142._24_4_ = auVar68._24_4_ * fVar97;
                    auVar142._28_4_ = 0;
                    auVar50 = vfmadd213ps_fma(auVar67,auVar88,auVar142);
                    auVar64 = vfmadd213ps_fma(auVar89,auVar87,ZEXT1632(auVar50));
                    auVar86 = vrcp14ps_avx512vl(auVar69);
                    auVar89._8_4_ = 0x3f800000;
                    auVar89._0_8_ = 0x3f8000003f800000;
                    auVar89._12_4_ = 0x3f800000;
                    auVar89._16_4_ = 0x3f800000;
                    auVar89._20_4_ = 0x3f800000;
                    auVar89._24_4_ = 0x3f800000;
                    auVar89._28_4_ = 0x3f800000;
                    auVar89 = vfnmadd213ps_avx512vl(auVar86,auVar69,auVar89);
                    auVar50 = vfmadd132ps_fma(auVar89,auVar86,auVar86);
                    local_1220._28_4_ = auVar86._28_4_;
                    local_1220._0_28_ =
                         ZEXT1628(CONCAT412(auVar50._12_4_ * (auVar64._12_4_ + auVar64._12_4_),
                                            CONCAT48(auVar50._8_4_ * (auVar64._8_4_ + auVar64._8_4_)
                                                     ,CONCAT44(auVar50._4_4_ *
                                                               (auVar64._4_4_ + auVar64._4_4_),
                                                               auVar50._0_4_ *
                                                               (auVar64._0_4_ + auVar64._0_4_)))));
                    auVar131 = ZEXT3264(local_1220);
                    auVar102._4_4_ = fVar120;
                    auVar102._0_4_ = fVar120;
                    auVar102._8_4_ = fVar120;
                    auVar102._12_4_ = fVar120;
                    auVar102._16_4_ = fVar120;
                    auVar102._20_4_ = fVar120;
                    auVar102._24_4_ = fVar120;
                    auVar102._28_4_ = fVar120;
                    uVar22 = vcmpps_avx512vl(local_1220,auVar102,2);
                    uVar5 = *(undefined4 *)(ray + local_1368 * 4 + 0x30);
                    auVar83._4_4_ = uVar5;
                    auVar83._0_4_ = uVar5;
                    auVar83._8_4_ = uVar5;
                    auVar83._12_4_ = uVar5;
                    auVar83._16_4_ = uVar5;
                    auVar83._20_4_ = uVar5;
                    auVar83._24_4_ = uVar5;
                    auVar83._28_4_ = uVar5;
                    uVar23 = vcmpps_avx512vl(local_1220,auVar83,0xd);
                    bVar47 = (byte)uVar22 & (byte)uVar23 & bVar47;
                    if (bVar47 != 0) {
                      uVar39 = vcmpps_avx512vl(auVar69,_DAT_01faff00,4);
                      uVar39 = bVar47 & uVar39;
                      local_1118 = (byte)uVar39;
                      if (local_1118 != 0) {
                        local_1120 = &local_1371;
                        local_10c0 = local_1220;
                        auVar89 = vsubps_avx(local_1140,auVar65);
                        auVar89 = vblendps_avx(auVar82,auVar89,0xf0);
                        auVar86 = vsubps_avx(local_1140,auVar82);
                        local_1160 = vblendps_avx(auVar65,auVar86,0xf0);
                        local_10a0[0] = auVar87._0_4_ * 1.0;
                        local_10a0[1] = auVar87._4_4_ * 1.0;
                        local_10a0[2] = auVar87._8_4_ * 1.0;
                        local_10a0[3] = auVar87._12_4_ * 1.0;
                        fStack_1090 = auVar87._16_4_ * -1.0;
                        fStack_108c = auVar87._20_4_ * -1.0;
                        fStack_1088 = auVar87._24_4_ * -1.0;
                        uStack_1084 = auVar87._28_4_;
                        local_1080[0] = auVar88._0_4_ * 1.0;
                        local_1080[1] = auVar88._4_4_ * 1.0;
                        local_1080[2] = auVar88._8_4_ * 1.0;
                        local_1080[3] = auVar88._12_4_ * 1.0;
                        fStack_1070 = auVar88._16_4_ * -1.0;
                        fStack_106c = auVar88._20_4_ * -1.0;
                        fStack_1068 = auVar88._24_4_ * -1.0;
                        uStack_1064 = auVar88._28_4_;
                        local_1060._4_4_ = fVar92 * 1.0;
                        local_1060._0_4_ = fVar49 * 1.0;
                        local_1060._8_4_ = fVar93 * 1.0;
                        local_1060._12_4_ = fVar94 * 1.0;
                        local_1060._16_4_ = fVar95 * -1.0;
                        local_1060._20_4_ = fVar96 * -1.0;
                        local_1060._24_4_ = fVar97 * -1.0;
                        local_1060._28_4_ =
                             (uint)bVar20 * auVar73._28_4_ | (uint)!bVar20 * auVar76._28_4_;
                        auVar86 = vpbroadcastd_avx512vl();
                        auVar86 = vpaddd_avx2(auVar86,_DAT_01fec4a0);
                        auVar126._0_4_ = (float)(int)(*(ushort *)(lVar31 + 8 + lVar40) - 1);
                        auVar126._4_12_ = auVar68._4_12_;
                        auVar129._4_12_ = ZEXT812(0) << 0x20;
                        auVar129._0_4_ = auVar126._0_4_;
                        auVar64 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar129);
                        auVar50 = vfnmadd213ss_fma(auVar64,auVar126,ZEXT416(0x40000000));
                        fVar120 = auVar64._0_4_ * auVar50._0_4_;
                        auVar86 = vcvtdq2ps_avx(auVar86);
                        fVar96 = auVar86._28_4_ + auVar89._28_4_;
                        fVar115 = (local_1140._0_4_ * auVar86._0_4_ + auVar89._0_4_) * fVar120;
                        fVar49 = (local_1140._4_4_ * auVar86._4_4_ + auVar89._4_4_) * fVar120;
                        local_1180._4_4_ = fVar49;
                        local_1180._0_4_ = fVar115;
                        fVar92 = (local_1140._8_4_ * auVar86._8_4_ + auVar89._8_4_) * fVar120;
                        local_1180._8_4_ = fVar92;
                        fVar93 = (local_1140._12_4_ * auVar86._12_4_ + auVar89._12_4_) * fVar120;
                        local_1180._12_4_ = fVar93;
                        fVar94 = (local_1140._16_4_ * auVar86._16_4_ + auVar89._16_4_) * fVar120;
                        local_1180._16_4_ = fVar94;
                        fVar95 = (local_1140._20_4_ * auVar86._20_4_ + auVar89._20_4_) * fVar120;
                        local_1180._20_4_ = fVar95;
                        fVar120 = (local_1140._24_4_ * auVar86._24_4_ + auVar89._24_4_) * fVar120;
                        local_1180._24_4_ = fVar120;
                        local_1180._28_4_ = fVar96;
                        pGVar10 = (context->scene->geometries).items[uVar36].ptr;
                        if ((pGVar10->mask & *(uint *)(ray + local_1368 * 4 + 0x90)) != 0) {
                          auVar89 = vpbroadcastd_avx512vl();
                          auVar89 = vpaddd_avx2(auVar89,_DAT_01fec4c0);
                          auVar89 = vcvtdq2ps_avx(auVar89);
                          auVar127._0_4_ = (float)(int)(*(ushort *)(lVar31 + 10 + lVar40) - 1);
                          auVar127._4_12_ = auVar82._4_12_;
                          auVar28._12_4_ = 0;
                          auVar28._0_12_ = ZEXT812(0);
                          auVar64 = vrcp14ss_avx512f(auVar28 << 0x20,ZEXT416((uint)auVar127._0_4_));
                          auVar50 = vfnmadd213ss_fma(auVar64,auVar127,ZEXT416(0x40000000));
                          fVar21 = auVar64._0_4_ * auVar50._0_4_;
                          auVar25._8_4_ = 0x219392ef;
                          auVar25._0_8_ = 0x219392ef219392ef;
                          auVar25._12_4_ = 0x219392ef;
                          auVar25._16_4_ = 0x219392ef;
                          auVar25._20_4_ = 0x219392ef;
                          auVar25._24_4_ = 0x219392ef;
                          auVar25._28_4_ = 0x219392ef;
                          uVar41 = vcmpps_avx512vl(local_1140,auVar25,5);
                          auVar86 = vrcp14ps_avx512vl(local_1140);
                          auVar130._8_4_ = 0x3f800000;
                          auVar130._0_8_ = 0x3f8000003f800000;
                          auVar130._12_4_ = 0x3f800000;
                          auVar130._16_4_ = 0x3f800000;
                          auVar130._20_4_ = 0x3f800000;
                          auVar130._24_4_ = 0x3f800000;
                          auVar130._28_4_ = 0x3f800000;
                          auVar50 = vfnmadd213ps_fma(local_1140,auVar86,auVar130);
                          auVar86 = vfmadd132ps_avx512vl(ZEXT1632(auVar50),auVar86,auVar86);
                          fVar145 = (float)((uint)((byte)uVar41 & 1) * auVar86._0_4_);
                          fVar97 = (float)((uint)((byte)(uVar41 >> 1) & 1) * auVar86._4_4_);
                          fVar146 = (float)((uint)((byte)(uVar41 >> 2) & 1) * auVar86._8_4_);
                          fVar147 = (float)((uint)((byte)(uVar41 >> 3) & 1) * auVar86._12_4_);
                          fVar1 = (float)((uint)((byte)(uVar41 >> 4) & 1) * auVar86._16_4_);
                          fVar2 = (float)((uint)((byte)(uVar41 >> 5) & 1) * auVar86._20_4_);
                          fVar3 = (float)((uint)((byte)(uVar41 >> 6) & 1) * auVar86._24_4_);
                          auVar26._4_4_ = fVar49 * fVar97;
                          auVar26._0_4_ = fVar115 * fVar145;
                          auVar26._8_4_ = fVar92 * fVar146;
                          auVar26._12_4_ = fVar93 * fVar147;
                          auVar26._16_4_ = fVar94 * fVar1;
                          auVar26._20_4_ = fVar95 * fVar2;
                          auVar26._24_4_ = fVar120 * fVar3;
                          auVar26._28_4_ = fVar96;
                          local_1100 = vminps_avx(auVar26,auVar130);
                          auVar27._4_4_ =
                               (local_1140._4_4_ * auVar89._4_4_ + local_1160._4_4_) * fVar21 *
                               fVar97;
                          auVar27._0_4_ =
                               (local_1140._0_4_ * auVar89._0_4_ + local_1160._0_4_) * fVar21 *
                               fVar145;
                          auVar27._8_4_ =
                               (local_1140._8_4_ * auVar89._8_4_ + local_1160._8_4_) * fVar21 *
                               fVar146;
                          auVar27._12_4_ =
                               (local_1140._12_4_ * auVar89._12_4_ + local_1160._12_4_) * fVar21 *
                               fVar147;
                          auVar27._16_4_ =
                               (local_1140._16_4_ * auVar89._16_4_ + local_1160._16_4_) * fVar21 *
                               fVar1;
                          auVar27._20_4_ =
                               (local_1140._20_4_ * auVar89._20_4_ + local_1160._20_4_) * fVar21 *
                               fVar2;
                          auVar27._24_4_ =
                               (local_1140._24_4_ * auVar89._24_4_ + local_1160._24_4_) * fVar21 *
                               fVar3;
                          auVar27._28_4_ = auVar89._28_4_ + local_1160._28_4_;
                          local_10e0 = vminps_avx(auVar27,auVar130);
                          auVar103._8_4_ = 0x7f800000;
                          auVar103._0_8_ = 0x7f8000007f800000;
                          auVar103._12_4_ = 0x7f800000;
                          auVar103._16_4_ = 0x7f800000;
                          auVar103._20_4_ = 0x7f800000;
                          auVar103._24_4_ = 0x7f800000;
                          auVar103._28_4_ = 0x7f800000;
                          auVar89 = vblendmps_avx512vl(auVar103,local_1220);
                          auVar90._0_4_ =
                               (uint)(local_1118 & 1) * auVar89._0_4_ |
                               (uint)!(bool)(local_1118 & 1) * 0x7f800000;
                          bVar20 = (bool)((byte)(uVar39 >> 1) & 1);
                          auVar90._4_4_ = (uint)bVar20 * auVar89._4_4_ | (uint)!bVar20 * 0x7f800000;
                          bVar20 = (bool)((byte)(uVar39 >> 2) & 1);
                          auVar90._8_4_ = (uint)bVar20 * auVar89._8_4_ | (uint)!bVar20 * 0x7f800000;
                          bVar20 = (bool)((byte)(uVar39 >> 3) & 1);
                          auVar90._12_4_ =
                               (uint)bVar20 * auVar89._12_4_ | (uint)!bVar20 * 0x7f800000;
                          bVar20 = (bool)((byte)(uVar39 >> 4) & 1);
                          auVar90._16_4_ =
                               (uint)bVar20 * auVar89._16_4_ | (uint)!bVar20 * 0x7f800000;
                          bVar20 = (bool)((byte)(uVar39 >> 5) & 1);
                          auVar90._20_4_ =
                               (uint)bVar20 * auVar89._20_4_ | (uint)!bVar20 * 0x7f800000;
                          bVar20 = (bool)((byte)(uVar39 >> 6) & 1);
                          auVar90._24_4_ =
                               (uint)bVar20 * auVar89._24_4_ | (uint)!bVar20 * 0x7f800000;
                          bVar20 = SUB81(uVar39 >> 7,0);
                          auVar90._28_4_ =
                               (uint)bVar20 * auVar89._28_4_ | (uint)!bVar20 * 0x7f800000;
                          auVar89 = vshufps_avx(auVar90,auVar90,0xb1);
                          auVar89 = vminps_avx(auVar90,auVar89);
                          auVar86 = vshufpd_avx(auVar89,auVar89,5);
                          auVar89 = vminps_avx(auVar89,auVar86);
                          auVar86 = vpermpd_avx2(auVar89,0x4e);
                          auVar89 = vminps_avx(auVar89,auVar86);
                          uVar22 = vcmpps_avx512vl(auVar90,auVar89,0);
                          uVar33 = (uint)uVar39;
                          if ((local_1118 & (byte)uVar22) != 0) {
                            uVar33 = (uint)(local_1118 & (byte)uVar22);
                          }
                          uVar24 = 0;
                          for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
                            uVar24 = uVar24 + 1;
                          }
                          uVar41 = (ulong)uVar24;
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1330 = vpbroadcastd_avx512vl();
                            local_1360 = vpbroadcastd_avx512vl();
                            local_1350 = ZEXT416(*(uint *)(ray + local_1368 * 4 + 0x80));
                            do {
                              uVar5 = *(undefined4 *)(local_1100 + uVar41 * 4);
                              local_1000._4_4_ = uVar5;
                              local_1000._0_4_ = uVar5;
                              local_1000._8_4_ = uVar5;
                              local_1000._12_4_ = uVar5;
                              uVar5 = *(undefined4 *)(local_10e0 + uVar41 * 4);
                              local_ff0._4_4_ = uVar5;
                              local_ff0._0_4_ = uVar5;
                              local_ff0._8_4_ = uVar5;
                              local_ff0._12_4_ = uVar5;
                              *(float *)(ray + k * 4 + 0x80) = local_10a0[uVar41 - 8];
                              local_1290.context = context->user;
                              local_1030 = local_10a0[uVar41];
                              fVar120 = local_1080[uVar41];
                              local_1020._4_4_ = fVar120;
                              local_1020._0_4_ = fVar120;
                              local_1020._8_4_ = fVar120;
                              local_1020._12_4_ = fVar120;
                              uVar5 = *(undefined4 *)(local_1060 + uVar41 * 4);
                              local_1010._4_4_ = uVar5;
                              local_1010._0_4_ = uVar5;
                              local_1010._8_4_ = uVar5;
                              local_1010._12_4_ = uVar5;
                              fStack_102c = local_1030;
                              fStack_1028 = local_1030;
                              fStack_1024 = local_1030;
                              local_fe0 = local_1360._0_8_;
                              uStack_fd8 = local_1360._8_8_;
                              local_fd0 = local_1330;
                              vpcmpeqd_avx2(ZEXT1632(local_1330),ZEXT1632(local_1330));
                              uStack_fbc = (local_1290.context)->instID[0];
                              local_fc0 = uStack_fbc;
                              uStack_fb8 = uStack_fbc;
                              uStack_fb4 = uStack_fbc;
                              uStack_fb0 = (local_1290.context)->instPrimID[0];
                              uStack_fac = uStack_fb0;
                              uStack_fa8 = uStack_fb0;
                              uStack_fa4 = uStack_fb0;
                              local_1320 = local_11a0;
                              local_1290.valid = (int *)local_1320;
                              local_1290.geometryUserPtr = pGVar10->userPtr;
                              local_1290.hit = (RTCHitN *)&local_1030;
                              local_1290.N = 4;
                              local_1290.ray = (RTCRayN *)ray;
                              if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar10->intersectionFilterN)(&local_1290);
                                auVar131 = ZEXT3264(local_1220);
                                k = local_1368;
                              }
                              uVar42 = vptestmd_avx512vl(local_1320,local_1320);
                              if ((uVar42 & 0xf) == 0) {
LAB_006fe81a:
                                *(undefined4 *)(ray + k * 4 + 0x80) = local_1350._0_4_;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_1290);
                                  auVar131 = ZEXT3264(local_1220);
                                  k = local_1368;
                                }
                                uVar42 = vptestmd_avx512vl(local_1320,local_1320);
                                uVar42 = uVar42 & 0xf;
                                bVar47 = (byte)uVar42;
                                if (bVar47 == 0) goto LAB_006fe81a;
                                fVar120 = *(float *)(local_1290.hit + 4);
                                fVar115 = *(float *)(local_1290.hit + 8);
                                fVar49 = *(float *)(local_1290.hit + 0xc);
                                bVar20 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar19 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_1290.ray + 0xc0) =
                                     (uint)(bVar47 & 1) * (int)*(float *)local_1290.hit |
                                     (uint)!(bool)(bVar47 & 1) * *(int *)(local_1290.ray + 0xc0);
                                *(uint *)(local_1290.ray + 0xc4) =
                                     (uint)bVar20 * (int)fVar120 |
                                     (uint)!bVar20 * *(int *)(local_1290.ray + 0xc4);
                                *(uint *)(local_1290.ray + 200) =
                                     (uint)bVar15 * (int)fVar115 |
                                     (uint)!bVar15 * *(int *)(local_1290.ray + 200);
                                *(uint *)(local_1290.ray + 0xcc) =
                                     (uint)bVar19 * (int)fVar49 |
                                     (uint)!bVar19 * *(int *)(local_1290.ray + 0xcc);
                                fVar120 = *(float *)(local_1290.hit + 0x14);
                                fVar115 = *(float *)(local_1290.hit + 0x18);
                                fVar49 = *(float *)(local_1290.hit + 0x1c);
                                bVar20 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar19 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_1290.ray + 0xd0) =
                                     (uint)(bVar47 & 1) * (int)*(float *)(local_1290.hit + 0x10) |
                                     (uint)!(bool)(bVar47 & 1) * *(int *)(local_1290.ray + 0xd0);
                                *(uint *)(local_1290.ray + 0xd4) =
                                     (uint)bVar20 * (int)fVar120 |
                                     (uint)!bVar20 * *(int *)(local_1290.ray + 0xd4);
                                *(uint *)(local_1290.ray + 0xd8) =
                                     (uint)bVar15 * (int)fVar115 |
                                     (uint)!bVar15 * *(int *)(local_1290.ray + 0xd8);
                                *(uint *)(local_1290.ray + 0xdc) =
                                     (uint)bVar19 * (int)fVar49 |
                                     (uint)!bVar19 * *(int *)(local_1290.ray + 0xdc);
                                fVar120 = *(float *)(local_1290.hit + 0x24);
                                fVar115 = *(float *)(local_1290.hit + 0x28);
                                fVar49 = *(float *)(local_1290.hit + 0x2c);
                                bVar20 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar19 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_1290.ray + 0xe0) =
                                     (uint)(bVar47 & 1) * (int)*(float *)(local_1290.hit + 0x20) |
                                     (uint)!(bool)(bVar47 & 1) * *(int *)(local_1290.ray + 0xe0);
                                *(uint *)(local_1290.ray + 0xe4) =
                                     (uint)bVar20 * (int)fVar120 |
                                     (uint)!bVar20 * *(int *)(local_1290.ray + 0xe4);
                                *(uint *)(local_1290.ray + 0xe8) =
                                     (uint)bVar15 * (int)fVar115 |
                                     (uint)!bVar15 * *(int *)(local_1290.ray + 0xe8);
                                *(uint *)(local_1290.ray + 0xec) =
                                     (uint)bVar19 * (int)fVar49 |
                                     (uint)!bVar19 * *(int *)(local_1290.ray + 0xec);
                                fVar120 = *(float *)(local_1290.hit + 0x34);
                                fVar115 = *(float *)(local_1290.hit + 0x38);
                                fVar49 = *(float *)(local_1290.hit + 0x3c);
                                bVar20 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar19 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_1290.ray + 0xf0) =
                                     (uint)(bVar47 & 1) * (int)*(float *)(local_1290.hit + 0x30) |
                                     (uint)!(bool)(bVar47 & 1) * *(int *)(local_1290.ray + 0xf0);
                                *(uint *)(local_1290.ray + 0xf4) =
                                     (uint)bVar20 * (int)fVar120 |
                                     (uint)!bVar20 * *(int *)(local_1290.ray + 0xf4);
                                *(uint *)(local_1290.ray + 0xf8) =
                                     (uint)bVar15 * (int)fVar115 |
                                     (uint)!bVar15 * *(int *)(local_1290.ray + 0xf8);
                                *(uint *)(local_1290.ray + 0xfc) =
                                     (uint)bVar19 * (int)fVar49 |
                                     (uint)!bVar19 * *(int *)(local_1290.ray + 0xfc);
                                fVar120 = *(float *)(local_1290.hit + 0x44);
                                fVar115 = *(float *)(local_1290.hit + 0x48);
                                fVar49 = *(float *)(local_1290.hit + 0x4c);
                                bVar20 = (bool)((byte)(uVar42 >> 1) & 1);
                                bVar15 = (bool)((byte)(uVar42 >> 2) & 1);
                                bVar19 = SUB81(uVar42 >> 3,0);
                                *(uint *)(local_1290.ray + 0x100) =
                                     (uint)(bVar47 & 1) * (int)*(float *)(local_1290.hit + 0x40) |
                                     (uint)!(bool)(bVar47 & 1) * *(int *)(local_1290.ray + 0x100);
                                *(uint *)(local_1290.ray + 0x104) =
                                     (uint)bVar20 * (int)fVar120 |
                                     (uint)!bVar20 * *(int *)(local_1290.ray + 0x104);
                                *(uint *)(local_1290.ray + 0x108) =
                                     (uint)bVar15 * (int)fVar115 |
                                     (uint)!bVar15 * *(int *)(local_1290.ray + 0x108);
                                *(uint *)(local_1290.ray + 0x10c) =
                                     (uint)bVar19 * (int)fVar49 |
                                     (uint)!bVar19 * *(int *)(local_1290.ray + 0x10c);
                                auVar50 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_1290.hit + 0x50));
                                *(undefined1 (*) [16])(local_1290.ray + 0x110) = auVar50;
                                auVar50 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                              (local_1290.hit + 0x60));
                                *(undefined1 (*) [16])(local_1290.ray + 0x120) = auVar50;
                                auVar50 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_1290.hit + 0x70));
                                *(undefined1 (*) [16])(local_1290.ray + 0x130) = auVar50;
                                auVar50 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                              (local_1290.hit + 0x80));
                                *(undefined1 (*) [16])(local_1290.ray + 0x140) = auVar50;
                                local_1350._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                                local_1350._4_4_ = 0;
                                local_1350._8_4_ = 0;
                                local_1350._12_4_ = 0;
                              }
                              bVar47 = ~(byte)(1 << ((uint)uVar41 & 0x1f)) & (byte)uVar39;
                              auVar104._4_4_ = local_1350._0_4_;
                              auVar104._0_4_ = local_1350._0_4_;
                              auVar104._8_4_ = local_1350._0_4_;
                              auVar104._12_4_ = local_1350._0_4_;
                              auVar104._16_4_ = local_1350._0_4_;
                              auVar104._20_4_ = local_1350._0_4_;
                              auVar104._24_4_ = local_1350._0_4_;
                              auVar104._28_4_ = local_1350._0_4_;
                              uVar22 = vcmpps_avx512vl(auVar131._0_32_,auVar104,2);
                              if ((bVar47 & (byte)uVar22) == 0) goto LAB_006fe538;
                              bVar47 = bVar47 & (byte)uVar22;
                              uVar39 = (ulong)bVar47;
                              auVar105._8_4_ = 0x7f800000;
                              auVar105._0_8_ = 0x7f8000007f800000;
                              auVar105._12_4_ = 0x7f800000;
                              auVar105._16_4_ = 0x7f800000;
                              auVar105._20_4_ = 0x7f800000;
                              auVar105._24_4_ = 0x7f800000;
                              auVar105._28_4_ = 0x7f800000;
                              auVar89 = vblendmps_avx512vl(auVar105,auVar131._0_32_);
                              auVar91._0_4_ =
                                   (uint)(bVar47 & 1) * auVar89._0_4_ |
                                   (uint)!(bool)(bVar47 & 1) * 0x7f800000;
                              bVar20 = (bool)(bVar47 >> 1 & 1);
                              auVar91._4_4_ =
                                   (uint)bVar20 * auVar89._4_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar47 >> 2 & 1);
                              auVar91._8_4_ =
                                   (uint)bVar20 * auVar89._8_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar47 >> 3 & 1);
                              auVar91._12_4_ =
                                   (uint)bVar20 * auVar89._12_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar47 >> 4 & 1);
                              auVar91._16_4_ =
                                   (uint)bVar20 * auVar89._16_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar47 >> 5 & 1);
                              auVar91._20_4_ =
                                   (uint)bVar20 * auVar89._20_4_ | (uint)!bVar20 * 0x7f800000;
                              bVar20 = (bool)(bVar47 >> 6 & 1);
                              auVar91._24_4_ =
                                   (uint)bVar20 * auVar89._24_4_ | (uint)!bVar20 * 0x7f800000;
                              auVar91._28_4_ =
                                   (uint)(bVar47 >> 7) * auVar89._28_4_ |
                                   (uint)!(bool)(bVar47 >> 7) * 0x7f800000;
                              auVar89 = vshufps_avx(auVar91,auVar91,0xb1);
                              auVar89 = vminps_avx(auVar91,auVar89);
                              auVar86 = vshufpd_avx(auVar89,auVar89,5);
                              auVar89 = vminps_avx(auVar89,auVar86);
                              auVar86 = vpermpd_avx2(auVar89,0x4e);
                              auVar89 = vminps_avx(auVar89,auVar86);
                              uVar22 = vcmpps_avx512vl(auVar91,auVar89,0);
                              bVar29 = (byte)uVar22 & bVar47;
                              if (bVar29 != 0) {
                                bVar47 = bVar29;
                              }
                              uVar36 = 0;
                              for (uVar34 = (uint)bVar47; (uVar34 & 1) == 0;
                                  uVar34 = uVar34 >> 1 | 0x80000000) {
                                uVar36 = uVar36 + 1;
                              }
                              uVar41 = (ulong)uVar36;
                            } while( true );
                          }
                          uVar5 = *(undefined4 *)(local_1100 + uVar41 * 4);
                          uVar6 = *(undefined4 *)(local_10e0 + uVar41 * 4);
                          fVar120 = local_10a0[uVar41];
                          fVar115 = local_1080[uVar41];
                          uVar7 = *(undefined4 *)(local_1060 + uVar41 * 4);
                          *(float *)(ray + local_1368 * 4 + 0x80) = local_10a0[uVar41 - 8];
                          *(float *)(ray + local_1368 * 4 + 0xc0) = fVar120;
                          *(float *)(ray + local_1368 * 4 + 0xd0) = fVar115;
                          *(undefined4 *)(ray + local_1368 * 4 + 0xe0) = uVar7;
                          *(undefined4 *)(ray + local_1368 * 4 + 0xf0) = uVar5;
                          *(undefined4 *)(ray + local_1368 * 4 + 0x100) = uVar6;
                          *(uint *)(ray + local_1368 * 4 + 0x110) = uVar34;
                          *(uint *)(ray + local_1368 * 4 + 0x120) = uVar36;
                          *(uint *)(ray + local_1368 * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + local_1368 * 4 + 0x140) = context->user->instPrimID[0];
                        }
                      }
                    }
                  }
LAB_006fe538:
                  auVar140 = ZEXT1664(local_11c0);
                  auVar143 = ZEXT1664(local_11d0);
                  auVar148 = ZEXT1664(local_1200);
                  auVar149 = ZEXT1664(local_11b0);
                  puVar30 = local_12a8;
                  uVar39 = local_1370;
                  uVar41 = local_12b0;
                  uVar42 = local_12b8;
                  uVar43 = local_12d0;
                  uVar45 = local_12c0;
                  uVar46 = local_12c8;
                  fVar115 = local_11e0;
                  fVar95 = fStack_11dc;
                  fVar96 = fStack_11d8;
                  fVar97 = fStack_11d4;
                  fVar49 = local_11f0;
                  fVar145 = fStack_11ec;
                  fVar146 = fStack_11e8;
                  fVar147 = fStack_11e4;
                }
                local_1298 = local_1298 - 1 & local_1298;
              } while (local_1298 != 0);
            }
            local_12d8 = local_12d8 + 1;
          } while (local_12d8 != local_12e0);
        }
        auVar50 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
        auVar149 = ZEXT1664(auVar50);
        auVar139 = ZEXT1664(local_1340);
        auVar136 = ZEXT1664(_local_1240);
        auVar131 = ZEXT1664(_local_1250);
        auVar133 = ZEXT1664(_local_1260);
        fVar92 = local_1230;
        fVar120 = fStack_122c;
        fVar93 = fStack_1228;
        fVar94 = fStack_1224;
        break;
      }
      auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar41),auVar139._0_16_);
      auVar98._0_4_ = fVar92 * auVar50._0_4_;
      auVar98._4_4_ = fVar120 * auVar50._4_4_;
      auVar98._8_4_ = fVar93 * auVar50._8_4_;
      auVar98._12_4_ = fVar94 * auVar50._12_4_;
      auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar42),auVar140._0_16_);
      auVar106._0_4_ = auVar136._0_4_ * auVar50._0_4_;
      auVar106._4_4_ = auVar136._4_4_ * auVar50._4_4_;
      auVar106._8_4_ = auVar136._8_4_ * auVar50._8_4_;
      auVar106._12_4_ = auVar136._12_4_ * auVar50._12_4_;
      auVar50 = vmaxps_avx(auVar98,auVar106);
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar45),auVar143._0_16_);
      auVar107._0_4_ = auVar131._0_4_ * auVar64._0_4_;
      auVar107._4_4_ = auVar131._4_4_ * auVar64._4_4_;
      auVar107._8_4_ = auVar131._8_4_ * auVar64._8_4_;
      auVar107._12_4_ = auVar131._12_4_ * auVar64._12_4_;
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar46),auVar139._0_16_);
      auVar116._0_4_ = auVar133._0_4_ * auVar64._0_4_;
      auVar116._4_4_ = auVar133._4_4_ * auVar64._4_4_;
      auVar116._8_4_ = auVar133._8_4_ * auVar64._8_4_;
      auVar116._12_4_ = auVar133._12_4_ * auVar64._12_4_;
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar43),auVar140._0_16_);
      auVar121._0_4_ = fVar115 * auVar64._0_4_;
      auVar121._4_4_ = fVar95 * auVar64._4_4_;
      auVar121._8_4_ = fVar96 * auVar64._8_4_;
      auVar121._12_4_ = fVar97 * auVar64._12_4_;
      auVar64 = vminps_avx(auVar116,auVar121);
      auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar44 + 0x20 + uVar39),auVar143._0_16_);
      auVar122._0_4_ = fVar49 * auVar51._0_4_;
      auVar122._4_4_ = fVar145 * auVar51._4_4_;
      auVar122._8_4_ = fVar146 * auVar51._8_4_;
      auVar122._12_4_ = fVar147 * auVar51._12_4_;
      auVar51 = vmaxps_avx512vl(auVar107,auVar148._0_16_);
      auVar50 = vmaxps_avx(auVar50,auVar51);
      auVar51 = vminps_avx512vl(auVar122,local_11b0);
      auVar64 = vminps_avx(auVar64,auVar51);
      uVar48 = vcmpps_avx512vl(auVar50,auVar64,2);
      local_1180._0_16_ = auVar50;
      if ((char)uVar48 != '\0') goto code_r0x006fd9f1;
      if (puVar30 == &local_fa0) {
        return;
      }
    }
    if (puVar30 == &local_fa0) {
      return;
    }
  } while( true );
code_r0x006fd9f1:
  uVar35 = uVar44 & 0xfffffffffffffff0;
  lVar31 = 0;
  for (uVar44 = uVar48; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar44 = *(ulong *)(uVar35 + lVar31 * 8);
  uVar36 = (uint)uVar48 - 1 & (uint)uVar48;
  uVar48 = (ulong)uVar36;
  if (uVar36 != 0) {
    uVar34 = *(uint *)(local_1180 + lVar31 * 4);
    lVar31 = 0;
    for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
      lVar31 = lVar31 + 1;
    }
    uVar36 = uVar36 - 1 & uVar36;
    uVar38 = (ulong)uVar36;
    uVar48 = *(ulong *)(uVar35 + lVar31 * 8);
    uVar33 = *(uint *)(local_1180 + lVar31 * 4);
    uVar39 = local_1370;
    if (uVar36 == 0) {
      if (uVar34 < uVar33) {
        *puVar30 = uVar48;
        *(uint *)(puVar30 + 1) = uVar33;
        puVar30 = puVar30 + 2;
      }
      else {
        *puVar30 = uVar44;
        *(uint *)(puVar30 + 1) = uVar34;
        puVar30 = puVar30 + 2;
        uVar44 = uVar48;
      }
    }
    else {
      auVar99._8_8_ = 0;
      auVar99._0_8_ = uVar44;
      auVar50 = vpunpcklqdq_avx(auVar99,ZEXT416(uVar34));
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uVar48;
      auVar64 = vpunpcklqdq_avx(auVar108,ZEXT416(uVar33));
      lVar31 = 0;
      for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar36 = uVar36 - 1 & uVar36;
      uVar44 = (ulong)uVar36;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = *(ulong *)(uVar35 + lVar31 * 8);
      auVar110 = vpunpcklqdq_avx(auVar109,ZEXT416(*(uint *)(local_1180 + lVar31 * 4)));
      auVar51 = vpshufd_avx(auVar50,0xaa);
      auVar52 = vpshufd_avx(auVar64,0xaa);
      auVar100 = vpshufd_avx(auVar110,0xaa);
      if (uVar36 == 0) {
        uVar44 = vpcmpgtd_avx512vl(auVar52,auVar51);
        uVar44 = uVar44 & 0xf;
        auVar52 = vpblendmd_avx512vl(auVar64,auVar50);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar53._0_4_ = (uint)bVar20 * auVar52._0_4_ | (uint)!bVar20 * auVar51._0_4_;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar20 * auVar52._4_4_ | (uint)!bVar20 * auVar51._4_4_;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar20 * auVar52._8_4_ | (uint)!bVar20 * auVar51._8_4_;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar53._12_4_ = (uint)bVar20 * auVar52._12_4_ | (uint)!bVar20 * auVar51._12_4_;
        auVar64 = vmovdqa32_avx512vl(auVar64);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar54._0_4_ = (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar50._0_4_;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar54._4_4_ = (uint)bVar20 * auVar64._4_4_ | (uint)!bVar20 * auVar50._4_4_;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar54._8_4_ = (uint)bVar20 * auVar64._8_4_ | (uint)!bVar20 * auVar50._8_4_;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar54._12_4_ = (uint)bVar20 * auVar64._12_4_ | (uint)!bVar20 * auVar50._12_4_;
        auVar50 = vpshufd_avx(auVar53,0xaa);
        uVar48 = vpcmpgtd_avx512vl(auVar100,auVar50);
        uVar48 = uVar48 & 0xf;
        auVar64 = vpblendmd_avx512vl(auVar110,auVar53);
        bVar20 = (bool)((byte)uVar48 & 1);
        bVar15 = (bool)((byte)(uVar48 >> 1) & 1);
        uVar44 = CONCAT44((uint)bVar15 * auVar64._4_4_ | (uint)!bVar15 * auVar50._4_4_,
                          (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar50._0_4_);
        auVar50 = vmovdqa32_avx512vl(auVar110);
        bVar20 = (bool)((byte)uVar48 & 1);
        auVar55._0_4_ = (uint)bVar20 * auVar50._0_4_ | !bVar20 * auVar53._0_4_;
        bVar20 = (bool)((byte)(uVar48 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar20 * auVar50._4_4_ | !bVar20 * auVar53._4_4_;
        bVar20 = (bool)((byte)(uVar48 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar20 * auVar50._8_4_ | !bVar20 * auVar53._8_4_;
        bVar20 = SUB81(uVar48 >> 3,0);
        auVar55._12_4_ = (uint)bVar20 * auVar50._12_4_ | !bVar20 * auVar53._12_4_;
        auVar50 = vpshufd_avx(auVar55,0xaa);
        auVar64 = vpshufd_avx(auVar54,0xaa);
        uVar48 = vpcmpgtd_avx512vl(auVar50,auVar64);
        uVar48 = uVar48 & 0xf;
        auVar64 = vpblendmd_avx512vl(auVar55,auVar54);
        bVar20 = (bool)((byte)uVar48 & 1);
        auVar56._0_4_ = (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar50._0_4_;
        bVar20 = (bool)((byte)(uVar48 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar20 * auVar64._4_4_ | (uint)!bVar20 * auVar50._4_4_;
        bVar20 = (bool)((byte)(uVar48 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar20 * auVar64._8_4_ | (uint)!bVar20 * auVar50._8_4_;
        bVar20 = SUB81(uVar48 >> 3,0);
        auVar56._12_4_ = (uint)bVar20 * auVar64._12_4_ | (uint)!bVar20 * auVar50._12_4_;
        auVar50 = vmovdqa32_avx512vl(auVar55);
        bVar20 = (bool)((byte)uVar48 & 1);
        bVar15 = (bool)((byte)(uVar48 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
        bVar16 = SUB81(uVar48 >> 3,0);
        *(uint *)puVar30 = (uint)bVar20 * auVar50._0_4_ | !bVar20 * auVar54._0_4_;
        *(uint *)((long)puVar30 + 4) = (uint)bVar15 * auVar50._4_4_ | !bVar15 * auVar54._4_4_;
        *(uint *)(puVar30 + 1) = (uint)bVar19 * auVar50._8_4_ | !bVar19 * auVar54._8_4_;
        *(uint *)((long)puVar30 + 0xc) = (uint)bVar16 * auVar50._12_4_ | !bVar16 * auVar54._12_4_;
        *(undefined1 (*) [16])(puVar30 + 2) = auVar56;
        puVar30 = puVar30 + 4;
      }
      else {
        lVar31 = 0;
        for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
          lVar31 = lVar31 + 1;
        }
        uVar36 = *(uint *)(local_1180 + lVar31 * 4);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)(uVar35 + lVar31 * 8);
        auVar101 = vpunpcklqdq_avx(auVar134,ZEXT416(uVar36));
        uVar44 = vpcmpgtd_avx512vl(auVar52,auVar51);
        uVar44 = uVar44 & 0xf;
        auVar52 = vpblendmd_avx512vl(auVar64,auVar50);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar57._0_4_ = (uint)bVar20 * auVar52._0_4_ | (uint)!bVar20 * auVar51._0_4_;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar20 * auVar52._4_4_ | (uint)!bVar20 * auVar51._4_4_;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar20 * auVar52._8_4_ | (uint)!bVar20 * auVar51._8_4_;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar57._12_4_ = (uint)bVar20 * auVar52._12_4_ | (uint)!bVar20 * auVar51._12_4_;
        auVar64 = vmovdqa32_avx512vl(auVar64);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar58._0_4_ = (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar50._0_4_;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar20 * auVar64._4_4_ | (uint)!bVar20 * auVar50._4_4_;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar20 * auVar64._8_4_ | (uint)!bVar20 * auVar50._8_4_;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar58._12_4_ = (uint)bVar20 * auVar64._12_4_ | (uint)!bVar20 * auVar50._12_4_;
        auVar117._4_4_ = uVar36;
        auVar117._0_4_ = uVar36;
        auVar117._8_4_ = uVar36;
        auVar117._12_4_ = uVar36;
        auVar139 = ZEXT1664(local_1340);
        uVar44 = vpcmpgtd_avx512vl(auVar117,auVar100);
        uVar44 = uVar44 & 0xf;
        auVar50 = vpblendmd_avx512vl(auVar101,auVar110);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar59._0_4_ = (uint)bVar20 * auVar50._0_4_ | !bVar20 * uVar36;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar20 * auVar50._4_4_ | !bVar20 * uVar36;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar20 * auVar50._8_4_ | !bVar20 * uVar36;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar59._12_4_ = (uint)bVar20 * auVar50._12_4_ | !bVar20 * uVar36;
        auVar50 = vmovdqa32_avx512vl(auVar101);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar60._0_4_ = (uint)bVar20 * auVar50._0_4_ | (uint)!bVar20 * auVar110._0_4_;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar20 * auVar50._4_4_ | (uint)!bVar20 * auVar110._4_4_;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar20 * auVar50._8_4_ | (uint)!bVar20 * auVar110._8_4_;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar60._12_4_ = (uint)bVar20 * auVar50._12_4_ | (uint)!bVar20 * auVar110._12_4_;
        auVar136 = ZEXT1664(auVar136._0_16_);
        auVar50 = vpshufd_avx(auVar60,0xaa);
        auVar64 = vpshufd_avx(auVar58,0xaa);
        uVar44 = vpcmpgtd_avx512vl(auVar50,auVar64);
        uVar44 = uVar44 & 0xf;
        auVar64 = vpblendmd_avx512vl(auVar60,auVar58);
        bVar20 = (bool)((byte)uVar44 & 1);
        auVar61._0_4_ = (uint)bVar20 * auVar64._0_4_ | (uint)!bVar20 * auVar50._0_4_;
        bVar20 = (bool)((byte)(uVar44 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar20 * auVar64._4_4_ | (uint)!bVar20 * auVar50._4_4_;
        bVar20 = (bool)((byte)(uVar44 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar20 * auVar64._8_4_ | (uint)!bVar20 * auVar50._8_4_;
        bVar20 = SUB81(uVar44 >> 3,0);
        auVar61._12_4_ = (uint)bVar20 * auVar64._12_4_ | (uint)!bVar20 * auVar50._12_4_;
        auVar51 = vmovdqa32_avx512vl(auVar60);
        bVar20 = (bool)((byte)uVar44 & 1);
        bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
        bVar17 = SUB81(uVar44 >> 3,0);
        auVar50 = vpshufd_avx(auVar59,0xaa);
        auVar64 = vpshufd_avx(auVar57,0xaa);
        uVar48 = vpcmpgtd_avx512vl(auVar50,auVar64);
        uVar48 = uVar48 & 0xf;
        auVar64 = vpblendmd_avx512vl(auVar59,auVar57);
        bVar15 = (bool)((byte)uVar48 & 1);
        bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
        uVar44 = CONCAT44((uint)bVar16 * auVar64._4_4_ | (uint)!bVar16 * auVar50._4_4_,
                          (uint)bVar15 * auVar64._0_4_ | (uint)!bVar15 * auVar50._0_4_);
        auVar50 = vmovdqa32_avx512vl(auVar59);
        bVar15 = (bool)((byte)uVar48 & 1);
        auVar62._0_4_ = (uint)bVar15 * auVar50._0_4_ | !bVar15 * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar48 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar15 * auVar50._4_4_ | !bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar48 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar15 * auVar50._8_4_ | !bVar15 * auVar57._8_4_;
        bVar15 = SUB81(uVar48 >> 3,0);
        auVar62._12_4_ = (uint)bVar15 * auVar50._12_4_ | !bVar15 * auVar57._12_4_;
        auVar50 = vpshufd_avx(auVar62,0xaa);
        auVar64 = vpshufd_avx(auVar61,0xaa);
        uVar48 = vpcmpgtd_avx512vl(auVar64,auVar50);
        uVar48 = uVar48 & 0xf;
        auVar64 = vpblendmd_avx512vl(auVar61,auVar62);
        bVar15 = (bool)((byte)uVar48 & 1);
        auVar63._0_4_ = (uint)bVar15 * auVar64._0_4_ | (uint)!bVar15 * auVar50._0_4_;
        bVar15 = (bool)((byte)(uVar48 >> 1) & 1);
        auVar63._4_4_ = (uint)bVar15 * auVar64._4_4_ | (uint)!bVar15 * auVar50._4_4_;
        bVar15 = (bool)((byte)(uVar48 >> 2) & 1);
        auVar63._8_4_ = (uint)bVar15 * auVar64._8_4_ | (uint)!bVar15 * auVar50._8_4_;
        bVar15 = SUB81(uVar48 >> 3,0);
        auVar63._12_4_ = (uint)bVar15 * auVar64._12_4_ | (uint)!bVar15 * auVar50._12_4_;
        auVar50 = vmovdqa32_avx512vl(auVar61);
        bVar15 = (bool)((byte)uVar48 & 1);
        bVar16 = (bool)((byte)(uVar48 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar48 >> 2) & 1);
        bVar18 = SUB81(uVar48 >> 3,0);
        *(uint *)puVar30 = (uint)bVar20 * auVar51._0_4_ | !bVar20 * auVar58._0_4_;
        *(uint *)((long)puVar30 + 4) = (uint)bVar19 * auVar51._4_4_ | !bVar19 * auVar58._4_4_;
        *(uint *)(puVar30 + 1) = (uint)bVar13 * auVar51._8_4_ | !bVar13 * auVar58._8_4_;
        *(uint *)((long)puVar30 + 0xc) = (uint)bVar17 * auVar51._12_4_ | !bVar17 * auVar58._12_4_;
        *(uint *)(puVar30 + 2) = (uint)bVar15 * auVar50._0_4_ | !bVar15 * auVar62._0_4_;
        *(uint *)((long)puVar30 + 0x14) = (uint)bVar16 * auVar50._4_4_ | !bVar16 * auVar62._4_4_;
        *(uint *)(puVar30 + 3) = (uint)bVar14 * auVar50._8_4_ | !bVar14 * auVar62._8_4_;
        *(uint *)((long)puVar30 + 0x1c) = (uint)bVar18 * auVar50._12_4_ | !bVar18 * auVar62._12_4_;
        *(undefined1 (*) [16])(puVar30 + 4) = auVar63;
        puVar30 = puVar30 + 6;
      }
      auVar131 = ZEXT1664(auVar131._0_16_);
      auVar133 = ZEXT1664(auVar133._0_16_);
    }
  }
  goto joined_r0x006fd957;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }